

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeLiteral(ParsedPatternInfo *this,UErrorCode *status)

{
  UChar32 UVar1;
  UErrorCode *status_local;
  ParsedPatternInfo *this_local;
  
  UVar1 = ParserState::peek(&this->state);
  if (UVar1 == -1) {
    ParserState::toParseException(&this->state,L"Expected unquoted literal but found EOL");
    *status = U_PATTERN_SYNTAX_ERROR;
  }
  else {
    UVar1 = ParserState::peek(&this->state);
    if (UVar1 == 0x27) {
      ParserState::next(&this->state);
      while (UVar1 = ParserState::peek(&this->state), UVar1 != 0x27) {
        UVar1 = ParserState::peek(&this->state);
        if (UVar1 == -1) {
          ParserState::toParseException(&this->state,L"Expected quoted literal but found EOL");
          *status = U_PATTERN_SYNTAX_ERROR;
          return;
        }
        ParserState::next(&this->state);
      }
      ParserState::next(&this->state);
    }
    else {
      ParserState::next(&this->state);
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeLiteral(UErrorCode& status) {
    if (state.peek() == -1) {
        state.toParseException(u"Expected unquoted literal but found EOL");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    } else if (state.peek() == u'\'') {
        state.next(); // consume the starting quote
        while (state.peek() != u'\'') {
            if (state.peek() == -1) {
                state.toParseException(u"Expected quoted literal but found EOL");
                status = U_PATTERN_SYNTAX_ERROR;
                return;
            } else {
                state.next(); // consume a quoted character
            }
        }
        state.next(); // consume the ending quote
    } else {
        // consume a non-quoted literal character
        state.next();
    }
}